

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O2

void __thiscall Nsf_Emu::unload(Nsf_Emu *this)

{
  free(this->vrc6);
  this->vrc6 = (Nes_Vrc6_Apu *)0x0;
  free(this->namco);
  this->namco = (Nes_Namco_Apu *)0x0;
  free(this->fme7);
  this->fme7 = (Nes_Fme7_Apu *)0x0;
  blargg_vector<unsigned_char>::clear((blargg_vector<unsigned_char> *)&this->rom);
  Music_Emu::unload((Music_Emu *)this);
  return;
}

Assistant:

void Nsf_Emu::unload()
{
	#if !NSF_EMU_APU_ONLY
	{
		delete vrc6;
		vrc6  = 0;
		
		delete namco;
		namco = 0;
		
		delete fme7;
		fme7  = 0;
	}
	#endif
	
	rom.clear();
	Music_Emu::unload();
}